

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
::unget(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
        *this)

{
  int iVar1;
  bool bVar2;
  int_type iVar3;
  long in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  *(undefined1 *)(in_RDI + 0x18) = 1;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
  if (*(long *)(in_RDI + 0x28) == 0) {
    if (*(long *)(in_RDI + 0x30) != 0) {
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
    }
  }
  else {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
  }
  iVar1 = *(int *)(in_RDI + 0x14);
  iVar3 = std::char_traits<char>::eof();
  if (iVar1 != iVar3) {
    bVar2 = std::vector<char,_std::allocator<char>_>::empty(unaff_retaddr);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!token_string.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/single_include/nlohmann/json.hpp"
                    ,0x1ef1,
                    "void nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<const char *>>::unget() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<const char *>]"
                   );
    }
    std::vector<char,_std::allocator<char>_>::pop_back
              ((vector<char,_std::allocator<char>_> *)0x138585);
  }
  return;
}

Assistant:

void unget()
    {
        next_unget = true;

        --position.chars_read_total;

        // in case we "unget" a newline, we have to also decrement the lines_read
        if (position.chars_read_current_line == 0)
        {
            if (position.lines_read > 0)
            {
                --position.lines_read;
            }
        }
        else
        {
            --position.chars_read_current_line;
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            JSON_ASSERT(!token_string.empty());
            token_string.pop_back();
        }
    }